

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall kj::Own<capnp::CallContextHook>::dispose(Own<capnp::CallContextHook> *this)

{
  CallContextHook *object;
  CallContextHook *ptrCopy;
  Own<capnp::CallContextHook> *this_local;
  
  object = this->ptr;
  if (object != (CallContextHook *)0x0) {
    this->ptr = (CallContextHook *)0x0;
    Disposer::dispose<capnp::CallContextHook>(this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }